

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void log_vprintf(log_handle *log,LOG_LEVEL lvl,char *fmt,__va_list_tag *args)

{
  void *pvVar1;
  time_t epoch;
  char tstamp [16];
  char buff [256];
  time_t local_140;
  char local_138 [16];
  tm local_128 [4];
  
  if ((lvl <= log->level) && (log->medium - 1 < 4)) {
    pvVar1 = log->priv;
    switch(log->medium) {
    case 1:
      if (lvl == LOG_LEVEL_FATAL) {
        vprintf(fmt,args);
        fflush(_stdout);
        return;
      }
      log_vprintf_cold_1();
      break;
    case 2:
      if (pvVar1 != (void *)0x0) {
        time(&local_140);
        localtime_r(&local_140,local_128);
        strftime(local_138,0x10,"%b %d %H:%M:%S",local_128);
        fprintf(*(FILE **)((long)pvVar1 + 8),"%s : ",local_138);
        vfprintf(*(FILE **)((long)pvVar1 + 8),fmt,args);
        fflush(*(FILE **)((long)pvVar1 + 8));
      }
      break;
    case 3:
      vsyslog(SYSLOG_LEVEL[lvl],fmt,args);
      return;
    case 4:
      if (pvVar1 != (void *)0x0) {
        memset(local_128,0,0x100);
        vsnprintf((char *)local_128,0x100,fmt,args);
      }
    }
  }
  return;
}

Assistant:

void log_vprintf(struct log_handle *log, enum LOG_LEVEL lvl,
		 const char *fmt, va_list args)
{
	struct log_priv *priv = log->priv;

	if ((unsigned int)lvl > log->level)
		return;

	switch (log->medium) {
	case LOG_MEDIUM_STDOUT:
		if (lvl >= LOG_LEVEL_ERROR) {
			vfprintf(stderr, fmt, args);
			fflush(stderr);
		} else {
			vprintf(fmt, args);
			fflush(stdout);
		}

		break;
	case LOG_MEDIUM_FILE:
		if (priv != NULL) {
			time_t epoch;
			struct tm cal_time;
			char tstamp[16];

			time(&epoch);
			localtime_r(&epoch, &cal_time);
			strftime(tstamp, 16, "%b %d %H:%M:%S", &cal_time);
			fprintf(priv->medium_file.fp, "%s : ", tstamp);

			vfprintf(priv->medium_file.fp, fmt, args);
			fflush(priv->medium_file.fp);
		}

		break;
	case LOG_MEDIUM_SYSLOG:
		vsyslog(SYSLOG_LEVEL[lvl], fmt, args);

		break;
	case LOG_MEDIUM_EVENTLOG:
		if (priv != NULL) {
			char buff[256] = "";
			const char *strings[2] = { 0 };

			strings[0] = buff;

			vsnprintf(buff, 256, fmt, args);

			ReportEvent(
				priv->medium_eventlog.handle,
				EVENTLOG_LEVEL[lvl],
				0,
				EVENTLOG_IDENT[lvl],
				NULL,
				1,
				0,
				strings,
				NULL);
		}

		break;
	}
}